

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YedisCommand.cpp
# Opt level: O2

bool __thiscall Yedis::YCommand::addCommand(YCommand *this,string *cmd,YedisCommand *command)

{
  byte bVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Yedis::YedisCommand_*>,_false,_true>,_bool>
  pVar2;
  string local_48 [32];
  YedisCommand *local_28;
  
  if (cmd->_M_string_length == 0) {
    bVar1 = 1;
  }
  else {
    std::__cxx11::string::string(local_48,(string *)cmd);
    local_28 = command;
    pVar2 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>,std::allocator<std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string,Yedis::YedisCommand_const*>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>,std::allocator<std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this,local_48);
    bVar1 = pVar2.second;
    std::__cxx11::string::~string(local_48);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool YCommand::addCommand(const std::string& cmd, const YedisCommand* command)
{
    if(cmd.empty())
    {
        return true;
    }

    return m_cmdInfo.insert(std::make_pair(cmd,command)).second;
}